

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_peer.cpp
# Opt level: O1

uint32_t __thiscall
libtorrent::aux::torrent_peer::rank(torrent_peer *this,external_ip *external,int external_port)

{
  uint32_t uVar1;
  address local_b8;
  address local_98;
  basic_endpoint<boost::asio::ip::tcp> local_70;
  basic_endpoint<boost::asio::ip::tcp> local_54;
  address local_38;
  
  if (this->peer_rank == 0) {
    if ((*(uint *)&this->field_0x1b >> 0x18 & 1) == 0) {
      if ((*(uint *)&this->field_0x1b >> 0x19 & 1) == 0) {
        local_98._0_8_ = (ulong)this[1].prev_amount_upload << 0x20;
        local_98.ipv6_address_.addr_.__in6_u._0_8_ = 0;
        local_98.ipv6_address_.addr_.__in6_u._8_8_ = (peer_connection_interface *)0x0;
      }
      else {
        local_98.ipv6_address_.addr_.__in6_u._8_8_ = (peer_connection_interface *)0x0;
        local_98.type_ = ipv4;
        local_98.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
        local_98.ipv6_address_.addr_.__in6_u._0_8_ = 0;
      }
    }
    else {
      local_98.ipv6_address_.addr_.__in6_u._0_4_ = this[1].prev_amount_upload;
      local_98.ipv6_address_.addr_.__in6_u._4_4_ = this[1].prev_amount_download;
      local_98.ipv6_address_.addr_.__in6_u._8_8_ = this[1].connection;
      local_98.type_ = ipv6;
      local_98.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
    }
    local_98.ipv6_address_.scope_id_ = 0;
    external_ip::external_address(&local_38,external,&local_98);
    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
              (&local_70,&local_38,(unsigned_short)external_port);
    if ((*(uint *)&this->field_0x1b >> 0x18 & 1) == 0) {
      if ((*(uint *)&this->field_0x1b >> 0x19 & 1) == 0) {
        local_b8._0_8_ = (ulong)this[1].prev_amount_upload << 0x20;
        local_b8.ipv6_address_.addr_.__in6_u._0_8_ = 0;
        local_b8.ipv6_address_.addr_.__in6_u._8_8_ = (peer_connection_interface *)0x0;
      }
      else {
        local_b8.ipv6_address_.addr_.__in6_u._8_8_ = (peer_connection_interface *)0x0;
        local_b8.type_ = ipv4;
        local_b8.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
        local_b8.ipv6_address_.addr_.__in6_u._0_8_ = 0;
      }
    }
    else {
      local_b8.ipv6_address_.addr_.__in6_u._0_4_ = this[1].prev_amount_upload;
      local_b8.ipv6_address_.addr_.__in6_u._4_4_ = this[1].prev_amount_download;
      local_b8.ipv6_address_.addr_.__in6_u._8_8_ = this[1].connection;
      local_b8.type_ = ipv6;
      local_b8.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
    }
    local_b8.ipv6_address_.scope_id_ = 0;
    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
              (&local_54,&local_b8,this->port);
    uVar1 = peer_priority(&local_70,&local_54);
    this->peer_rank = uVar1;
  }
  return this->peer_rank;
}

Assistant:

std::uint32_t torrent_peer::rank(aux::external_ip const& external, int external_port) const
	{
		TORRENT_ASSERT(in_use);
		//TODO: how do we deal with our external address changing?
		if (peer_rank == 0)
			peer_rank = peer_priority(
				tcp::endpoint(external.external_address(this->address()), std::uint16_t(external_port))
				, tcp::endpoint(this->address(), this->port));
		return peer_rank;
	}